

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_string_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::RepeatedStringFieldGenerator::GeneratePrivateMembers
          (RepeatedStringFieldGenerator *this,Printer *printer)

{
  Formatter format;
  Printer *in_stack_ffffffffffffff98;
  _Base_ptr in_stack_ffffffffffffffd8;
  Formatter *in_stack_ffffffffffffffe0;
  
  Formatter::Formatter
            ((Formatter *)&stack0xffffffffffffffb8,in_stack_ffffffffffffff98,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)0x572d8b);
  Formatter::operator()<>(in_stack_ffffffffffffffe0,(char *)in_stack_ffffffffffffffd8);
  Formatter::~Formatter((Formatter *)0x572da8);
  return;
}

Assistant:

void RepeatedStringFieldGenerator::GeneratePrivateMembers(
    io::Printer* printer) const {
  Formatter format(printer, variables_);
  format("::$proto_ns$::RepeatedPtrField<std::string> $name$_;\n");
}